

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memtable.cc
# Opt level: O3

Slice __thiscall leveldb::MemTableIterator::value(MemTableIterator *this)

{
  Node *pNVar1;
  uint uVar2;
  char *pcVar3;
  char *pcVar4;
  long in_FS_OFFSET;
  Slice SVar5;
  uint local_14;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  pNVar1 = (this->iter_).node_;
  if (pNVar1 == (Node *)0x0) {
    __assert_fail("Valid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/skiplist.h"
                  ,0xca,
                  "const Key &leveldb::SkipList<const char *, leveldb::MemTable::KeyComparator>::Iterator::key() const [Key = const char *, Comparator = leveldb::MemTable::KeyComparator]"
                 );
  }
  pcVar3 = pNVar1->key;
  if (*pcVar3 < '\0') {
    pcVar4 = GetVarint32PtrFallback(pcVar3,pcVar3 + 5,&local_14);
    uVar2 = local_14;
  }
  else {
    pcVar4 = pcVar3 + 1;
    uVar2 = (int)*pcVar3;
  }
  pcVar3 = pcVar4 + uVar2;
  if (pcVar4[uVar2] < 0) {
    pcVar3 = GetVarint32PtrFallback(pcVar3,pcVar3 + 5,&local_14);
  }
  else {
    pcVar3 = pcVar3 + 1;
    local_14 = (int)pcVar4[uVar2];
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    SVar5.size_._0_4_ = local_14;
    SVar5.data_ = pcVar3;
    SVar5.size_._4_4_ = 0;
    return SVar5;
  }
  __stack_chk_fail();
}

Assistant:

Slice value() const override {
    Slice key_slice = GetLengthPrefixedSlice(iter_.key());
    return GetLengthPrefixedSlice(key_slice.data() + key_slice.size());
  }